

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O3

size_t Encode(uint8_t *rgba,int width,int height,int stride,Importer import,float quality_factor,
             int lossless,uint8_t **output)

{
  int iVar1;
  WebPPicture pic;
  WebPConfig config;
  uint8_t *local_1c8;
  size_t sStack_1c0;
  undefined8 local_1b8;
  WebPPicture local_1a8;
  WebPConfig local_a4;
  
  if (output != (uint8_t **)0x0) {
    iVar1 = WebPConfigInitInternal(&local_a4,WEBP_PRESET_DEFAULT,quality_factor,0x20f);
    if (iVar1 == 0) {
      return 0;
    }
    memset(&local_1a8,0,0x100);
    local_1a8.writer = DummyWriter;
    WebPEncodingSetError(&local_1a8,VP8_ENC_OK);
    local_1a8.use_argb = (int)(lossless != 0);
    local_1a8.writer = WebPMemoryWrite;
    local_1a8.custom_ptr = &local_1c8;
    local_1c8 = (uint8_t *)0x0;
    sStack_1c0 = 0;
    local_1b8 = 0;
    local_1a8.width = width;
    local_1a8.height = height;
    local_a4.lossless = local_1a8.use_argb;
    iVar1 = (*import)(&local_1a8,rgba,stride);
    if (iVar1 == 0) {
      WebPSafeFree(local_1a8.memory_);
      WebPSafeFree(local_1a8.memory_argb_);
    }
    else {
      iVar1 = WebPEncode(&local_a4,&local_1a8);
      WebPSafeFree(local_1a8.memory_);
      WebPSafeFree(local_1a8.memory_argb_);
      if (iVar1 != 0) {
        *output = local_1c8;
        return sStack_1c0;
      }
    }
    local_1a8.memory_argb_ = (void *)0x0;
    local_1a8.memory_ = (void *)0x0;
    local_1a8.argb_stride = 0;
    local_1a8.argb = (uint32_t *)0x0;
    local_1a8._52_8_ = 0;
    local_1a8.a._0_4_ = 0;
    local_1a8.uv_stride = 0;
    local_1a8.y_stride = 0;
    local_1a8.v = (uint8_t *)0x0;
    local_1a8.u = (uint8_t *)0x0;
    local_1a8.y = (uint8_t *)0x0;
    WebPSafeFree(local_1c8);
    *output = (uint8_t *)0x0;
  }
  return 0;
}

Assistant:

static size_t Encode(const uint8_t* rgba, int width, int height, int stride,
                     Importer import, float quality_factor, int lossless,
                     uint8_t** output) {
  WebPPicture pic;
  WebPConfig config;
  WebPMemoryWriter wrt;
  int ok;

  if (output == NULL) return 0;

  if (!WebPConfigPreset(&config, WEBP_PRESET_DEFAULT, quality_factor) ||
      !WebPPictureInit(&pic)) {
    return 0;  // shouldn't happen, except if system installation is broken
  }

  config.lossless = !!lossless;
  pic.use_argb = !!lossless;
  pic.width = width;
  pic.height = height;
  pic.writer = WebPMemoryWrite;
  pic.custom_ptr = &wrt;
  WebPMemoryWriterInit(&wrt);

  ok = import(&pic, rgba, stride) && WebPEncode(&config, &pic);
  WebPPictureFree(&pic);
  if (!ok) {
    WebPMemoryWriterClear(&wrt);
    *output = NULL;
    return 0;
  }
  *output = wrt.mem;
  return wrt.size;
}